

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

StringPtr * __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::insert
          (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *this,
          StringPtr *row)

{
  uint uVar1;
  undefined4 *puVar2;
  ulong uVar3;
  size_t newSize;
  long lVar4;
  Iterator iter;
  int local_6c;
  Iterator local_68;
  long local_50;
  long local_48;
  SearchKey local_40;
  Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *local_38;
  long *local_30;
  int *local_28;
  
  local_50 = *(long *)this;
  lVar4 = *(long *)(this + 8) - local_50 >> 2;
  local_38 = this + 0x20;
  local_6c = *(int *)&(row->content).ptr;
  local_28 = &local_6c;
  local_30 = &local_50;
  local_40._vptr_SearchKey = (_func_int **)&PTR_search_001b8c08;
  local_48 = lVar4;
  _::BTreeImpl::insert(&local_68,(BTreeImpl *)(this + 0x28),&local_40);
  uVar3 = (ulong)local_68.row;
  if (uVar3 == 0xe) {
    uVar3 = 0xe;
  }
  else {
    uVar1 = (local_68.leaf)->rows[uVar3].i;
    if ((uVar1 != 0) && (*(int *)(local_50 + (ulong)(uVar1 - 1) * 4) == local_6c)) {
      _::throwDuplicateTableRow();
    }
  }
  memmove((local_68.leaf)->rows + uVar3 + 1,(local_68.leaf)->rows + uVar3,
          (ulong)(local_68.row + 1) * -4 + 0x38);
  (local_68.leaf)->rows[uVar3].i = (int)lVar4 + 1;
  puVar2 = *(undefined4 **)(this + 8);
  if (puVar2 == *(undefined4 **)(this + 0x10)) {
    newSize = 4;
    if (puVar2 != *(undefined4 **)this) {
      newSize = (long)puVar2 - (long)*(undefined4 **)this >> 1;
    }
    Vector<unsigned_int>::setCapacity((Vector<unsigned_int> *)this,newSize);
    puVar2 = *(undefined4 **)(this + 8);
  }
  *puVar2 = *(undefined4 *)&(row->content).ptr;
  *(StringPtr **)(this + 8) = (StringPtr *)(puVar2 + 1);
  return (StringPtr *)(puVar2 + 1);
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }